

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_PKH(DisasContext_conflict1 *s,arg_PKH *a)

{
  int arg2;
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  ulong uVar2;
  _Bool _Var3;
  TCGTemp *pTVar4;
  int32_t arg2_00;
  TCGv_i32 arg2_01;
  TCGv_i32 arg1;
  TCGv_i32 var;
  uintptr_t o;
  TCGv_i32 var_00;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  arg2 = a->imm;
  if (s->thumb == 0) {
    uVar2 = s->features & 8;
  }
  else {
    uVar2 = s->features >> 0x22 & 1;
  }
  if (uVar2 == 0) {
    _Var3 = false;
  }
  else {
    iVar1 = a->rn;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar4 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = a->rm;
    s_01 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)pTVar4 - (long)s_01);
    load_reg_var(s,var_00,iVar1);
    if (a->tb == 0) {
      tcg_gen_shli_i32_aarch64(s_00,var_00,var_00,arg2);
      arg2_01 = var;
      arg1 = var_00;
    }
    else {
      arg2_00 = 0x1f;
      if (arg2 != 0) {
        arg2_00 = arg2;
      }
      tcg_gen_sari_i32_aarch64(s_00,var_00,var_00,arg2_00);
      arg2_01 = var_00;
      arg1 = var;
    }
    tcg_gen_deposit_i32_aarch64(s_00,var,arg1,arg2_01,0,0x10);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
    store_reg(s,a->rd,var);
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool trans_PKH(DisasContext *s, arg_PKH *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tn, tm;
    int shift = a->imm;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    tn = load_reg(s, a->rn);
    tm = load_reg(s, a->rm);
    if (a->tb) {
        /* PKHTB */
        if (shift == 0) {
            shift = 31;
        }
        tcg_gen_sari_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tn, tm, 0, 16);
    } else {
        /* PKHBT */
        tcg_gen_shli_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tm, tn, 0, 16);
    }
    tcg_temp_free_i32(tcg_ctx, tm);
    store_reg(s, a->rd, tn);
    return true;
}